

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int test_node_get_children(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  char *__ptr;
  children_s *children;
  uint32_t expected12 [96];
  uint8_t expected11 [96];
  trie_s *trie;
  int res;
  
  plVar3 = (long *)yatrie_new(500,500,100);
  *(undefined4 *)(*plVar3 + 8) = 0x17;
  *(undefined4 *)(*plVar3 + 0x14) = 0;
  memset(expected12 + 0x5e,0,0x60);
  expected12[0x5e]._0_1_ = 1;
  expected12[0x5e]._1_1_ = 2;
  expected12[0x5e]._2_1_ = 3;
  expected12[0x5e]._3_1_ = 5;
  memset(&children,0,0x180);
  children._0_4_ = 0x457;
  children._4_4_ = 0x8ae;
  expected12[0] = 0xd05;
  *(undefined4 *)(plVar3[1] + 8) = 0x457;
  *(undefined4 *)(plVar3[1] + 0xc) = 0x8ae;
  *(undefined4 *)(plVar3[1] + 0x10) = 0xd05;
  __ptr = (char *)calloc(1,0x1e4);
  yatrie_node_get_children(__ptr,0,plVar3);
  cVar1 = *__ptr;
  if (cVar1 != '\x03') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x295,"children->length == 3");
  }
  trie._4_4_ = (uint)(cVar1 != '\x03');
  iVar2 = memcmp(__ptr + 1,expected12 + 0x5e,3);
  if (iVar2 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x296,"memcmp(children->letters, expected11, 3) == 0");
    trie._4_4_ = trie._4_4_ + 1;
  }
  iVar2 = memcmp(__ptr + 100,&children,0xc);
  if (iVar2 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x297,"memcmp(children->nodes, expected12, 3 << REF_SIZE_POWER) == 0");
    trie._4_4_ = trie._4_4_ + 1;
  }
  yatrie_free(plVar3);
  free(__ptr);
  return trie._4_4_;
}

Assistant:

static int test_node_get_children() {
    int res = 0;

    trie_s *trie = yatrie_new(500, 500, 100);


    //add some data to the root node
    trie->nodes->data[0].mask[0] = 0b10111; //raise bits 1,2,3,5
    trie->nodes->data[0].ref_id = 0; //save ref_id
    uint8_t expected11[MASK_BITS] = {1, 2, 3, 5}; //raise bits 1,2,3,5
    uint32_t expected12[MASK_BITS] = {1111, 2222, 3333}; //references data
    trie->refs->data[0] = 1111; //ref_id 0
    trie->refs->data[1] = 2222; //ref_id 1
    trie->refs->data[2] = 3333; //ref_id 2

    //create children container
    children_s *children = (children_s *) calloc(1, sizeof(children_s));

    //get children
    yatrie_node_get_children(children, 0, trie);

    //check saved values
    U_ASSERT(res, children->length == 3); //check counter
    U_ASSERT(res, memcmp(children->letters, expected11, 3) == 0); //check letters
    U_ASSERT(res, memcmp(children->nodes, expected12, 3 << REF_SIZE_POWER) == 0); //check nodes

    yatrie_free(trie);
    free(children);
    return res;
}